

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

bool __thiscall CMU462::StaticScene::Sphere::intersect(Sphere *this,Ray *r,Intersection *i)

{
  return false;
}

Assistant:

bool Sphere::intersect(const Ray& r, Intersection *i) const {

  // TODO:
  // Implement ray - sphere intersection.
  // Note again that you might want to use the the Sphere::test helper here.
  // When an intersection takes place, the Intersection data should be updated
  // correspondingly.

  return false;

}